

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZHCurlEquationFilter.cpp
# Opt level: O3

void __thiscall
TPZHCurlEquationFilter<std::complex<double>_>::UpdateEdgeAndFaceStatus
          (TPZHCurlEquationFilter<std::complex<double>_> *this,int64_t *remEdge)

{
  map<long,_TPZHCurlEquationFilter<std::complex<double>_>::EdgeFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<std::complex<double>_>::EdgeFilter>_>_>
  *this_00;
  FaceStatusType FVar1;
  map<long,_TPZHCurlEquationFilter<std::complex<double>_>::FaceFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<std::complex<double>_>::FaceFilter>_>_>
  *this_01;
  mapped_type *pmVar2;
  mapped_type *pmVar3;
  _Rb_tree_node_base *p_Var4;
  _Base_ptr p_Var5;
  _Rb_tree_header *p_Var6;
  long lVar7;
  int iedge;
  set<int,_std::less<int>,_std::allocator<int>_> blockedEdges;
  long local_80;
  _Rb_tree_color local_74;
  map<long,_TPZHCurlEquationFilter<std::complex<double>_>::FaceFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<std::complex<double>_>::FaceFilter>_>_>
  *local_70;
  _Rb_tree_node_base *local_68;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  this_00 = &this->mEdge;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  pmVar2 = std::
           map<long,_TPZHCurlEquationFilter<std::complex<double>_>::EdgeFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<std::complex<double>_>::EdgeFilter>_>_>
           ::operator[](this_00,remEdge);
  p_Var5 = (pmVar2->face_connect)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var6 = &(pmVar2->face_connect)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var5 != p_Var6) {
    local_70 = &this->mFace;
    local_68 = &p_Var6->_M_header;
    do {
      lVar7 = (long)(int)p_Var5[1]._M_color;
      local_80 = lVar7;
      pmVar3 = std::
               map<long,_TPZHCurlEquationFilter<std::complex<double>_>::FaceFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<std::complex<double>_>::FaceFilter>_>_>
               ::operator[](local_70,&local_80);
      this_01 = local_70;
      FVar1 = pmVar3->status;
      if (FVar1 == EFreeFace) {
        local_80 = lVar7;
        pmVar3 = std::
                 map<long,_TPZHCurlEquationFilter<std::complex<double>_>::FaceFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<std::complex<double>_>::FaceFilter>_>_>
                 ::operator[](local_70,&local_80);
        pmVar3->status = ECryticalFace;
      }
      else if ((FVar1 & ~EBlockedFace) == ECryticalFace) {
        local_80 = lVar7;
        pmVar3 = std::
                 map<long,_TPZHCurlEquationFilter<std::complex<double>_>::FaceFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<std::complex<double>_>::FaceFilter>_>_>
                 ::operator[](local_70,&local_80);
        pmVar3->status = EBlockedFace;
        local_80 = lVar7;
        pmVar3 = std::
                 map<long,_TPZHCurlEquationFilter<std::complex<double>_>::FaceFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<std::complex<double>_>::FaceFilter>_>_>
                 ::operator[](this_01,&local_80);
        for (p_Var4 = (pmVar3->edge_connect)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var4 != &(pmVar3->edge_connect)._M_t._M_impl.super__Rb_tree_header;
            p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
          local_74 = p_Var4[1]._M_color;
          local_80 = (long)(int)local_74;
          pmVar2 = std::
                   map<long,_TPZHCurlEquationFilter<std::complex<double>_>::EdgeFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<std::complex<double>_>::EdgeFilter>_>_>
                   ::operator[](this_00,&local_80);
          if (pmVar2->status == EFreeEdge) {
            local_80 = (long)(int)local_74;
            pmVar2 = std::
                     map<long,_TPZHCurlEquationFilter<std::complex<double>_>::EdgeFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<std::complex<double>_>::EdgeFilter>_>_>
                     ::operator[](this_00,&local_80);
            pmVar2->status = EBlockedEdge;
            std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
            _M_insert_unique<int_const&>
                      ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                       &local_60,(int *)&local_74);
            break;
          }
        }
      }
      else if (FVar1 == EBlockedFace) {
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/TPZHCurlEquationFilter.cpp"
                   ,0xc4);
      }
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    } while (p_Var5 != local_68);
  }
  if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_60._M_impl.super__Rb_tree_header) {
    p_Var5 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      local_80 = (long)(int)p_Var5[1]._M_color;
      pmVar2 = std::
               map<long,_TPZHCurlEquationFilter<std::complex<double>_>::EdgeFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<std::complex<double>_>::EdgeFilter>_>_>
               ::operator[](this_00,&local_80);
      for (p_Var4 = (pmVar2->face_connect)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var4 != &(pmVar2->face_connect)._M_t._M_impl.super__Rb_tree_header;
          p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
        local_80 = (long)(int)p_Var4[1]._M_color;
        pmVar3 = std::
                 map<long,_TPZHCurlEquationFilter<std::complex<double>_>::FaceFilter,_std::less<long>,_std::allocator<std::pair<const_long,_TPZHCurlEquationFilter<std::complex<double>_>::FaceFilter>_>_>
                 ::operator[](&this->mFace,&local_80);
        pmVar3->status = EFortunateFace;
      }
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    } while ((_Rb_tree_header *)p_Var5 != &local_60._M_impl.super__Rb_tree_header);
  }
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&local_60);
  return;
}

Assistant:

void TPZHCurlEquationFilter<TVar>::UpdateEdgeAndFaceStatus(int64_t &remEdge)
{
    std::set<int> blockedEdges;

    //Look at the faces where the removed edge is a part of and updates its status
    for (auto iface : mEdge[remEdge].face_connect)
    {
        auto status = mFace[iface].status;
        if (status == EFreeFace){
            mFace[iface].status = ECryticalFace;
        } else if (status == ECryticalFace || status == EFortunateFace) { // here there is a ?
            mFace[iface].status = EBlockedFace;

            //Loops over the edges of a face. If it is a free edge, then block it
            for (auto iedge : mFace[iface].edge_connect){
                if (mEdge[iedge].status == EFreeEdge){
                    mEdge[iedge].status = EBlockedEdge;
                    blockedEdges.insert(iedge);
                    break;
                }
            }
        } else if (status == EBlockedFace){
            DebugStop();
        } 
    }//iface

    // Now we can update all the faces in the mesh, as we can have some blocked 
    // edges and it will produce fortunate faces.
    for (auto iedge : blockedEdges)
    {
        for (auto iface : mEdge[iedge].face_connect){
            mFace[iface].status = EFortunateFace;
        }
    }    
}